

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O0

void __thiscall QtMWidgets::SwitchPrivate::initOffset(SwitchPrivate *this,QRect *r)

{
  State SVar1;
  int iVar2;
  QRect *r_local;
  SwitchPrivate *this_local;
  
  SVar1 = this->state;
  if (SVar1 < NotAcceptedCheck) {
    this->offset = 0;
  }
  else if (SVar1 == NotAcceptedCheck || SVar1 == AcceptedCheck) {
    iVar2 = QRect::width(r);
    this->offset = iVar2 + this->radius * -2 + -2;
  }
  return;
}

Assistant:

void
SwitchPrivate::initOffset( const QRect & r )
{
	switch( state )
	{
		case Switch::NotAcceptedCheck :
		case Switch::AcceptedCheck :
			offset = r.width() - radius * 2 - 2;
		break;

		case Switch::NotAcceptedUncheck :
		case Switch::AcceptedUncheck :
			offset = 0;
		break;
	}
}